

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void __thiscall
Assimp::SceneCombiner::AddNodeHashes
          (SceneCombiner *this,aiNode *node,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes)

{
  uint uVar1;
  SceneCombiner *pSVar2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *extraout_RDX;
  uint uVar3;
  ulong uVar4;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar5;
  uint local_1c;
  
  uVar1 = *(uint *)this;
  if (uVar1 == 0) goto LAB_003a8f38;
  pSVar2 = this + 4;
  local_1c = 0;
  if (3 < uVar1) {
    uVar3 = uVar1 >> 2;
    local_1c = 0;
    do {
      local_1c = (*(ushort *)pSVar2 + local_1c) * 0x10000 ^
                 (uint)*(ushort *)(pSVar2 + 2) << 0xb ^ *(ushort *)pSVar2 + local_1c;
      pSVar2 = pSVar2 + 4;
      local_1c = (local_1c >> 0xb) + local_1c;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  switch(uVar1 & 3) {
  case 1:
    uVar1 = (local_1c + (int)(char)*pSVar2) * 0x400 ^ local_1c + (int)(char)*pSVar2;
    local_1c = uVar1 >> 1;
    goto LAB_003a8edd;
  case 2:
    uVar1 = (local_1c + *(ushort *)pSVar2) * 0x800 ^ local_1c + *(ushort *)pSVar2;
    local_1c = uVar1 >> 0x11;
LAB_003a8edd:
    local_1c = local_1c + uVar1;
    break;
  case 3:
    local_1c = (local_1c + *(ushort *)pSVar2) * 0x10000 ^
               (int)(char)pSVar2[2] << 0x12 ^ local_1c + *(ushort *)pSVar2;
    local_1c = (local_1c >> 0xb) + local_1c;
  }
  local_1c = local_1c * 8 ^ local_1c;
  local_1c = (local_1c >> 5) + local_1c;
  local_1c = local_1c * 0x10 ^ local_1c;
  local_1c = (local_1c >> 0x11) + local_1c;
  local_1c = local_1c * 0x2000000 ^ local_1c;
  local_1c = (local_1c >> 6) + local_1c;
  pVar5 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>
                    ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)node,&local_1c);
  hashes = pVar5._8_8_;
LAB_003a8f38:
  if (*(int *)(this + 0x450) != 0) {
    uVar4 = 0;
    do {
      AddNodeHashes(*(SceneCombiner **)(*(long *)(this + 0x458) + uVar4 * 8),node,hashes);
      uVar4 = uVar4 + 1;
      hashes = extraout_RDX;
    } while (uVar4 < *(uint *)(this + 0x450));
  }
  return;
}

Assistant:

void SceneCombiner::AddNodeHashes(aiNode* node, std::set<unsigned int>& hashes) {
    // Add node name to hashing set if it is non-empty - empty nodes are allowed
    // and they can't have any anims assigned so its absolutely safe to duplicate them.
    if (node->mName.length) {
        hashes.insert( SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length)) );
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodeHashes(node->mChildren[i],hashes);
}